

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessage::DynamicMessage(DynamicMessage *this,TypeInfo *type_info)

{
  TypeInfo *type_info_local;
  DynamicMessage *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_008ebfb8;
  this->type_info_ = type_info;
  std::atomic<int>::atomic(&this->cached_byte_size_,0);
  SharedCtor(this,true);
  return;
}

Assistant:

DynamicMessage::DynamicMessage(const DynamicMessageFactory::TypeInfo* type_info)
    : type_info_(type_info), cached_byte_size_(0) {
  SharedCtor(true);
}